

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O0

void __thiscall CLayerTiles::Shift(CLayerTiles *this,int Direction)

{
  undefined4 in_ESI;
  void *in_RDI;
  int y_3;
  int y_2;
  int y_1;
  int y;
  void *in_stack_ffffffffffffffc8;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  
  switch(in_ESI) {
  case 1:
    for (local_10 = 0; local_10 < *(int *)((long)in_RDI + 0x38); local_10 = local_10 + 1) {
      mem_move(in_RDI,in_stack_ffffffffffffffc8,0);
    }
    break;
  case 2:
    for (local_14 = 0; local_14 < *(int *)((long)in_RDI + 0x38); local_14 = local_14 + 1) {
      mem_move(in_RDI,in_stack_ffffffffffffffc8,0);
    }
    break;
  case 4:
    for (local_18 = 0; local_18 < *(int *)((long)in_RDI + 0x38) + -1; local_18 = local_18 + 1) {
      mem_copy(in_RDI,in_stack_ffffffffffffffc8,0);
    }
    break;
  case 8:
    local_1c = *(int *)((long)in_RDI + 0x38);
    while (local_1c = local_1c + -1, 0 < local_1c) {
      mem_copy(in_RDI,in_stack_ffffffffffffffc8,0);
    }
  }
  s_lastBrushX = -1;
  s_lastBrushY = -1;
  return;
}

Assistant:

void CLayerTiles::Shift(int Direction)
{
	switch(Direction)
	{
	case 1:
		{
			// left
			for(int y = 0; y < m_Height; ++y)
				mem_move(&m_pTiles[y*m_Width], &m_pTiles[y*m_Width+1], (m_Width-1)*sizeof(CTile));
		}
		break;
	case 2:
		{
			// right
			for(int y = 0; y < m_Height; ++y)
				mem_move(&m_pTiles[y*m_Width+1], &m_pTiles[y*m_Width], (m_Width-1)*sizeof(CTile));
		}
		break;
	case 4:
		{
			// up
			for(int y = 0; y < m_Height-1; ++y)
				mem_copy(&m_pTiles[y*m_Width], &m_pTiles[(y+1)*m_Width], m_Width*sizeof(CTile));
		}
		break;
	case 8:
		{
			// down
			for(int y = m_Height-1; y > 0; --y)
				mem_copy(&m_pTiles[y*m_Width], &m_pTiles[(y-1)*m_Width], m_Width*sizeof(CTile));
		}
	}

	s_lastBrushX = -1;
	s_lastBrushY = -1;
}